

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O0

R QBitArray::bitLocation<QBitArray>(QBitArray *ba,qsizetype i)

{
  long lVar1;
  undefined8 extraout_RDX;
  byte in_SIL;
  long in_FS_OFFSET;
  R RVar2;
  qsizetype bitIdx;
  qsizetype byteIdx;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RVar2.byte = QByteArray::operator[]
                         ((QByteArray *)
                          CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0x11318d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    RVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
    RVar2.bitMask = (char)(1 << (in_SIL & 7));
    return RVar2;
  }
  __stack_chk_fail();
}

Assistant:

static auto bitLocation(BitArray &ba, qsizetype i)
    {
        Q_ASSERT(size_t(i) < size_t(ba.size()));
        struct R {
            decltype(ba.d[1]) byte;
            uchar bitMask;
        };
        qsizetype byteIdx = i >> 3;
        qsizetype bitIdx = i & 7;
        return R{ ba.d[1 + byteIdx], uchar(1U << bitIdx) };
    }